

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

float * stbi_loadf_from_memory(stbi_uc *buffer,int len,int *x,int *y,int *comp,int req_comp)

{
  float *pfVar1;
  int in_ESI;
  stbi_uc *in_RDI;
  stbi__context s;
  int in_stack_ffffffffffffff1c;
  int *in_stack_ffffffffffffff20;
  int *in_stack_ffffffffffffff28;
  int *in_stack_ffffffffffffff30;
  stbi__context *in_stack_ffffffffffffff38;
  
  stbi__start_mem((stbi__context *)&stack0xfffffffffffffef0,in_RDI,in_ESI);
  pfVar1 = stbi__loadf_main(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                            in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                            in_stack_ffffffffffffff1c);
  return pfVar1;
}

Assistant:

STBIDEF float *stbi_loadf_from_memory(stbi_uc const *buffer, int len, int *x, int *y, int *comp, int req_comp)
{
   stbi__context s;
   stbi__start_mem(&s,buffer,len);
   return stbi__loadf_main(&s,x,y,comp,req_comp);
}